

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

uint32_t __thiscall spvtools::opt::InlinePass::GetFalseId(InlinePass *this)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  uint32_t result_id;
  string message;
  size_type __dnew;
  size_t *local_68;
  size_t local_60;
  size_t local_58 [2];
  spv_position_t local_48;
  
  if (this->false_id_ != 0) {
    return this->false_id_;
  }
  uVar2 = Module::GetGlobalValue
                    ((((this->super_Pass).context_)->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                     OpConstantFalse);
  this->false_id_ = uVar2;
  if (uVar2 != 0) {
    return uVar2;
  }
  uVar2 = Module::GetGlobalValue
                    ((((this->super_Pass).context_)->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,OpTypeBool)
  ;
  if (uVar2 == 0) {
    pIVar1 = (this->super_Pass).context_;
    uVar2 = Module::TakeNextIdBound
                      ((pIVar1->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
    if ((uVar2 == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
    {
      local_48.line = 0x25;
      local_68 = local_58;
      local_68 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
      local_58[0] = local_48.line;
      *local_68 = 0x667265766f204449;
      local_68[1] = 0x797254202e776f6c;
      local_68[2] = 0x676e696e6e757220;
      local_68[3] = 0x746361706d6f6320;
      builtin_strncpy((char *)((long)local_68 + 0x1d),"act-ids.",8);
      local_60 = local_48.line;
      *(char *)((long)local_68 + local_48.line) = '\0';
      local_48.line = 0;
      local_48.column = 0;
      local_48.index = 0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_48,(char *)local_68);
      if (local_68 != local_58) {
        operator_delete(local_68,local_58[0] + 1);
      }
    }
    if (uVar2 == 0) {
      return 0;
    }
    Module::AddGlobalValue
              ((((this->super_Pass).context_)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,OpTypeBool,uVar2,
               0);
  }
  pIVar1 = (this->super_Pass).context_;
  result_id = Module::TakeNextIdBound
                        ((pIVar1->module_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((result_id == 0) &&
     ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_68 = local_58;
    local_48.line = 0x25;
    local_68 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_48);
    local_58[0] = local_48.line;
    *local_68 = 0x667265766f204449;
    local_68[1] = 0x797254202e776f6c;
    local_68[2] = 0x676e696e6e757220;
    local_68[3] = 0x746361706d6f6320;
    builtin_strncpy((char *)((long)local_68 + 0x1d),"act-ids.",8);
    local_60 = local_48.line;
    *(char *)((long)local_68 + local_48.line) = '\0';
    local_48.line = 0;
    local_48.column = 0;
    local_48.index = 0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_48,(char *)local_68);
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
  }
  this->false_id_ = result_id;
  if (result_id == 0) {
    return 0;
  }
  Module::AddGlobalValue
            ((((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,OpConstantFalse,
             result_id,uVar2);
  return this->false_id_;
}

Assistant:

uint32_t InlinePass::GetFalseId() {
  if (false_id_ != 0) return false_id_;
  false_id_ = get_module()->GetGlobalValue(spv::Op::OpConstantFalse);
  if (false_id_ != 0) return false_id_;
  uint32_t boolId = get_module()->GetGlobalValue(spv::Op::OpTypeBool);
  if (boolId == 0) {
    boolId = context()->TakeNextId();
    if (boolId == 0) {
      return 0;
    }
    get_module()->AddGlobalValue(spv::Op::OpTypeBool, boolId, 0);
  }
  false_id_ = context()->TakeNextId();
  if (false_id_ == 0) {
    return 0;
  }
  get_module()->AddGlobalValue(spv::Op::OpConstantFalse, false_id_, boolId);
  return false_id_;
}